

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  MessageLite *pMVar1;
  int iVar2;
  Extension *pEVar3;
  undefined4 extraout_var;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 == (Extension *)0x0) {
    return default_value;
  }
  if (pEVar3->is_repeated == false) {
    if (0xed < (byte)(pEVar3->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 10) {
        pMVar1 = (MessageLite *)(pEVar3->field_0).int64_t_value;
        if ((pEVar3->field_0xa & 4) == 0) {
          return pMVar1;
        }
        iVar2 = (*pMVar1->_vptr_MessageLite[3])(pMVar1,default_value,this->arena_);
        return (MessageLite *)CONCAT44(extraout_var,iVar2);
      }
      goto LAB_001d276f;
    }
  }
  else {
    GetMessage();
  }
  GetMessage();
LAB_001d276f:
  GetMessage();
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->GetMessage(default_value,
                                                          arena_);
    } else {
      return *extension->ptr.message_value;
    }
  }
}